

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

bool Kernel::InferenceStore::Smt2ProofCheckPrinter::isBuiltInSort(ostream *out,uint sortCons)

{
  uint arity;
  Signature *pSVar1;
  bool bVar2;
  TermList sort;
  ostream *poVar3;
  TermList TVar4;
  Stack<Kernel::TermList> args;
  Stack<Kernel::TermList> local_68;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_InferenceStore_cpp:856:20),_Kernel::TermList>_>
  local_48;
  
  pSVar1 = DAT_00a14190;
  arity = (DAT_00a14190->_typeCons)._stack[(int)sortCons]->_arity;
  local_48._iter =
       (MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_InferenceStore_cpp:856:20),_Kernel::TermList>
        )(ZEXT416(arity) << 0x60);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/InferenceStore.cpp:856:20),_Kernel::TermList>_>
  ::collect<Lib::Stack>(&local_68,&local_48);
  sort._content = (uint64_t)AtomicSort::create(sortCons,arity,local_68._stack);
  bVar2 = Signature::isTermAlgebraSort(DAT_00a14190,sort);
  if (bVar2) {
    poVar3 = std::operator<<(out,
                             "=== warning term algebras are not yet implemented for proof checking =="
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  bVar2 = true;
  if (((pSVar1->_arrayCon != sortCons || pSVar1->_arrayCon == 0xffffffff) &&
      (TVar4 = AtomicSort::intSort(), TVar4._content != sort._content)) &&
     (TVar4 = AtomicSort::realSort(), TVar4._content != sort._content)) {
    TVar4 = AtomicSort::rationalSort();
    bVar2 = TVar4._content == sort._content;
  }
  Lib::Stack<Kernel::TermList>::~Stack(&local_68);
  return bVar2;
}

Assistant:

static bool isBuiltInSort(std::ostream& out, unsigned sortCons) {
    auto& sig = *env.signature;
    auto arity = sig.typeConArity(sortCons);
    auto args = range(0, arity)
              .map([](auto _a) { return AtomicSort::intSort(); })
              .template collect<Stack>();
    auto sortInstance = TermList(AtomicSort::create(sortCons, arity, args.begin()));
    if (env.signature->isTermAlgebraSort(sortInstance)) {
      out << "=== warning term algebras are not yet implemented for proof checking ==" << std::endl;
    }
    return sig.isArrayCon(sortCons)
      || sortInstance == AtomicSort::intSort()
      || sortInstance == AtomicSort::realSort()
      || sortInstance == AtomicSort::rationalSort();
  }